

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOptionCommand.cxx
# Opt level: O0

bool __thiscall
cmOptionCommand::InitialPass
          (cmOptionCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  CacheEntryType CVar2;
  size_type sVar3;
  const_reference pvVar4;
  cmState *this_00;
  const_reference value;
  char *pcVar5;
  char *doc;
  ostream *poVar6;
  PolicyID id;
  char *local_348;
  bool local_2e9;
  string local_2e8;
  string local_2c8;
  undefined1 local_2a8 [8];
  ostringstream w;
  cmStateSnapshot local_130;
  string *local_118;
  string *existsAfterSet;
  undefined1 local_108 [6];
  bool init;
  string initialValue;
  string local_e0;
  char *local_c0;
  char *existingValue;
  cmState *state;
  string *local_98;
  string *existsBeforeSet;
  PolicyStatus status;
  bool checkAndWarn;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string m;
  bool argError;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmOptionCommand *this_local;
  
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  local_2e9 = true;
  if (1 < sVar3) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    local_2e9 = 3 < sVar3;
  }
  m.field_2._M_local_buf[0xf] = local_2e9;
  if (local_2e9 == false) {
    existsBeforeSet._7_1_ = 0;
    existsBeforeSet._0_4_ =
         cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0077,false);
    cmMakefile::GetStateSnapshot((cmStateSnapshot *)&state,(this->super_cmCommand).Makefile);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    local_98 = cmStateSnapshot::GetDefinition((cmStateSnapshot *)&state,pvVar4);
    if ((PolicyStatus)existsBeforeSet != OLD) {
      if ((PolicyStatus)existsBeforeSet == WARN) {
        existsBeforeSet._7_1_ = local_98 != (string *)0x0;
      }
      else if (((PolicyStatus)existsBeforeSet - NEW < 3) && (local_98 != (string *)0x0)) {
        return true;
      }
    }
    this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
    existingValue = (char *)this_00;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    local_c0 = cmState::GetCacheEntryValue(this_00,pvVar4);
    pcVar5 = existingValue;
    if (local_c0 != (char *)0x0) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,0);
      CVar2 = cmState::GetCacheEntryType((cmState *)pcVar5,pvVar4);
      pcVar5 = existingValue;
      if (CVar2 != UNINITIALIZED) {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"HELPSTRING",
                   (allocator<char> *)(initialValue.field_2._M_local_buf + 0xf));
        value = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](args,1);
        cmState::SetCacheEntryProperty((cmState *)pcVar5,pvVar4,&local_e0,value);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(initialValue.field_2._M_local_buf + 0xf));
        return true;
      }
    }
    if (local_c0 == (char *)0x0) {
      local_348 = "Off";
    }
    else {
      local_348 = local_c0;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_108,local_348,(allocator<char> *)((long)&existsAfterSet + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&existsAfterSet + 7));
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar3 == 3) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,2);
      std::__cxx11::string::operator=((string *)local_108,(string *)pvVar4);
    }
    existsAfterSet._6_1_ = cmSystemTools::IsOn((string *)local_108);
    pcVar1 = (this->super_cmCommand).Makefile;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    pcVar5 = "OFF";
    if ((existsAfterSet._6_1_ & 1) != 0) {
      pcVar5 = "ON";
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](args,1);
    doc = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddCacheDefinition(pcVar1,pvVar4,pcVar5,doc,BOOL,false);
    if ((existsBeforeSet._7_1_ & 1) != 0) {
      cmMakefile::GetStateSnapshot(&local_130,(this->super_cmCommand).Makefile);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,0);
      local_118 = cmStateSnapshot::GetDefinition(&local_130,pvVar4);
      if (local_118 == (string *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a8);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2c8,(cmPolicies *)0x4d,id);
        poVar6 = std::operator<<((ostream *)local_2a8,(string *)&local_2c8);
        poVar6 = std::operator<<(poVar6,
                                 "\nFor compatibility with older versions of CMake, option is clearing the normal variable \'"
                                );
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,0);
        poVar6 = std::operator<<(poVar6,(string *)pvVar4);
        std::operator<<(poVar6,"\'.");
        std::__cxx11::string::~string((string *)&local_2c8);
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_2e8);
        std::__cxx11::string::~string((string *)&local_2e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a8);
      }
    }
    this_local._7_1_ = true;
    std::__cxx11::string::~string((string *)local_108);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,"called with incorrect number of arguments: ",&local_51);
    std::allocator<char>::~allocator(&local_51);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)&status,args," ");
    std::__cxx11::string::operator+=((string *)local_50,(string *)&status);
    std::__cxx11::string::~string((string *)&status);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_50);
    this_local._7_1_ = false;
    std::__cxx11::string::~string((string *)local_50);
  }
  return this_local._7_1_;
}

Assistant:

bool cmOptionCommand::InitialPass(std::vector<std::string> const& args,
                                  cmExecutionStatus&)
{
  const bool argError = (args.size() < 2) || (args.size() > 3);
  if (argError) {
    std::string m = "called with incorrect number of arguments: ";
    m += cmJoin(args, " ");
    this->SetError(m);
    return false;
  }

  // Determine the state of the option policy
  bool checkAndWarn = false;
  {
    auto status = this->Makefile->GetPolicyStatus(cmPolicies::CMP0077);
    const auto* existsBeforeSet =
      this->Makefile->GetStateSnapshot().GetDefinition(args[0]);
    switch (status) {
      case cmPolicies::WARN:
        checkAndWarn = (existsBeforeSet != nullptr);
        break;
      case cmPolicies::OLD:
        // OLD behavior does not warn.
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW: {
        // See if a local variable with this name already exists.
        // If so we ignore the option command.
        if (existsBeforeSet) {
          return true;
        }
      } break;
    }
  }

  // See if a cache variable with this name already exists
  // If so just make sure the doc state is correct
  cmState* state = this->Makefile->GetState();
  const char* existingValue = state->GetCacheEntryValue(args[0]);
  if (existingValue &&
      (state->GetCacheEntryType(args[0]) != cmStateEnums::UNINITIALIZED)) {
    state->SetCacheEntryProperty(args[0], "HELPSTRING", args[1]);
    return true;
  }

  // Nothing in the cache so add it
  std::string initialValue = existingValue ? existingValue : "Off";
  if (args.size() == 3) {
    initialValue = args[2];
  }
  bool init = cmSystemTools::IsOn(initialValue);
  this->Makefile->AddCacheDefinition(args[0], init ? "ON" : "OFF",
                                     args[1].c_str(), cmStateEnums::BOOL);

  if (checkAndWarn) {
    const auto* existsAfterSet =
      this->Makefile->GetStateSnapshot().GetDefinition(args[0]);
    if (!existsAfterSet) {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0077)
        << "\n"
           "For compatibility with older versions of CMake, option "
           "is clearing the normal variable '"
        << args[0] << "'.";
      this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
    }
  }
  return true;
}